

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cpp
# Opt level: O0

bool __thiscall MeCab::Writer::writeWakati(Writer *this,Lattice *lattice,StringBuffer *os)

{
  long lVar1;
  size_t in_RCX;
  StringBuffer *in_RDX;
  long *in_RSI;
  Node *node;
  char in_stack_ffffffffffffffdf;
  StringBuffer *this_00;
  
  lVar1 = (**(code **)(*in_RSI + 0x10))();
  for (this_00 = *(StringBuffer **)(lVar1 + 8); this_00->size_ != 0;
      this_00 = (StringBuffer *)this_00->size_) {
    StringBuffer::write(in_RDX,(int)this_00[1].size_,
                        (void *)(ulong)*(ushort *)((long)&this_00[1].ptr_ + 4),in_RCX);
    StringBuffer::operator<<(this_00,in_stack_ffffffffffffffdf);
  }
  StringBuffer::operator<<(this_00,in_stack_ffffffffffffffdf);
  return true;
}

Assistant:

bool Writer::writeWakati(Lattice *lattice, StringBuffer *os) const {
  for (const Node *node = lattice->bos_node()->next;
       node->next; node = node->next) {
    os->write(node->surface, node->length);
    *os << ' ';
  }
  *os << '\n';
  return true;
}